

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

bool __thiscall
DynamicGraph::bdbfsStep
          (DynamicGraph *this,list<unsigned_long,_std::allocator<unsigned_long>_> *queue,
          vector<bool,_std::allocator<bool>_> *visitedV,
          vector<bool,_std::allocator<bool>_> *visitedU,
          list<unsigned_long,_std::allocator<unsigned_long>_> *visitedList)

{
  boost *this_00;
  type_conflict tVar1;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  undefined1 uVar6;
  undefined7 uVar7;
  reference local_f8;
  reference local_e0;
  reference local_d0;
  reference local_c0;
  unsigned_long local_a8;
  Vertex vvTarget;
  pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>_>
  local_90;
  undefined1 local_70 [8];
  OutEdgeIterator ei_end;
  OutEdgeIterator ei;
  Vertex vv;
  list<unsigned_long,_std::allocator<unsigned_long>_> *visitedList_local;
  vector<bool,_std::allocator<bool>_> *visitedU_local;
  vector<bool,_std::allocator<bool>_> *visitedV_local;
  list<unsigned_long,_std::allocator<unsigned_long>_> *queue_local;
  DynamicGraph *this_local;
  
  uVar6 = SUB81(visitedU,0);
  uVar7 = (undefined7)((ulong)visitedU >> 8);
  pvVar4 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::front(queue);
  this_00 = (boost *)*pvVar4;
  join_0x00000010_0x00000000_ =
       std::vector<bool,_std::allocator<bool>_>::operator[](visitedV,(size_type)this_00);
  std::_Bit_reference::operator=((_Bit_reference *)&ei.m_src,true);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(queue);
  boost::detail::
  out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                   *)&ei_end.m_src);
  boost::detail::
  out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                   *)local_70);
  boost::
  out_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            (&local_90,this_00,(vertex_descriptor)this,
             (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
              *)CONCAT71(uVar7,uVar6));
  boost::tuples::
  tie<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>>
            ((tuples *)&vvTarget,
             (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
              *)&ei_end.m_src,
             (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
              *)local_70);
  boost::tuples::
  tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&vvTarget,&local_90);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&ei_end.m_src,
                       (iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)local_70);
    if (!tVar1) {
      return true;
    }
    boost::iterators::detail::
    iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator*(&local_c0,
                (iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                 *)&ei_end.m_src);
    local_a8 = boost::
               target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                         (&local_c0.super_edge_base<boost::undirected_tag,_unsigned_long>,
                          &this->super_UndirectedGraph);
    local_d0 = std::vector<bool,_std::allocator<bool>_>::operator[](visitedU,local_a8);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
    if (bVar2) break;
    local_e0 = std::vector<bool,_std::allocator<bool>_>::operator[](visitedV,local_a8);
    bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_e0);
    bVar2 = false;
    if (!bVar3) {
      boost::iterators::detail::
      iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
      ::operator*(&local_f8,
                  (iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                   *)&ei_end.m_src);
      sVar5 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(&this->virtualEdges,&local_f8);
      bVar2 = sVar5 == 0;
    }
    if (bVar2) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back(queue,&local_a8);
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (visitedList,&local_a8);
    }
    boost::iterators::detail::
    iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                  *)&ei_end.m_src);
  }
  return false;
}

Assistant:

bool DynamicGraph::bdbfsStep(std::list<Vertex>& queue, std::vector<bool>& visitedV,
               std::vector<bool>& visitedU, std::list<Vertex>& visitedList)
{
    Vertex vv = queue.front();
    visitedV[vv]=true;
    queue.pop_front();

    OutEdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = out_edges(vv, *this); ei != ei_end; ++ei) {
        Vertex vvTarget = target(*ei, *this);
        if (visitedU[vvTarget]) {
            return false;
        }
        if(!visitedV[vvTarget] && !virtualEdges.count(*ei)){
            queue.push_back(vvTarget);
            visitedList.push_back(vvTarget);
        }
    }
    return true;
}